

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_254152::AlsaCapture::stop(AlsaCapture *this)

{
  pointer ptr;
  ALCuint samples;
  int iVar1;
  size_type __n;
  vector<al::byte> temp;
  allocator_type local_39;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> local_38;
  
  samples = availableSamples(this);
  if ((samples != 0) &&
     ((this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
      super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
      super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl == (RingBuffer *)0x0)) {
    __n = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,samples);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::vector(&local_38,__n,&local_39);
    captureSamples(this,local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                        .super__Vector_impl_data._M_start,samples);
    ptr = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
          super__Vector_impl_data._M_start;
    (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_start = (byte *)0x0;
    local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ptr != (pointer)0x0) {
      al_free(ptr);
      if (local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        al_free(local_38.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                super__Vector_impl_data._M_start);
      }
    }
  }
  iVar1 = (*(anonymous_namespace)::psnd_pcm_drop)(this->mPcmHandle);
  if ((iVar1 < 0) && (0 < (int)gLogLevel)) {
    _GLOBAL__N_1::AlsaCapture::stop();
  }
  this->mDoCapture = false;
  return;
}

Assistant:

void AlsaCapture::stop()
{
    /* OpenAL requires access to unread audio after stopping, but ALSA's
     * snd_pcm_drain is unreliable and snd_pcm_drop drops it. Capture what's
     * available now so it'll be available later after the drop.
     */
    ALCuint avail{availableSamples()};
    if(!mRing && avail > 0)
    {
        /* The ring buffer implicitly captures when checking availability.
         * Direct access needs to explicitly capture it into temp storage. */
        auto temp = al::vector<al::byte>(
            static_cast<size_t>(snd_pcm_frames_to_bytes(mPcmHandle, avail)));
        captureSamples(temp.data(), avail);
        mBuffer = std::move(temp);
    }
    int err{snd_pcm_drop(mPcmHandle)};
    if(err < 0)
        ERR("drop failed: %s\n", snd_strerror(err));
    mDoCapture = false;
}